

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O2

void __thiscall re2::PrefilterTree::~PrefilterTree(PrefilterTree *this)

{
  pointer ppPVar1;
  Prefilter *this_00;
  pointer pEVar2;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  size_t i;
  ulong uVar3;
  long lVar4;
  size_t i_1;
  
  for (uVar3 = 0;
      ppPVar1 = (this->prefilter_vec_).
                super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->prefilter_vec_).
                            super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppPVar1[uVar3];
    if (this_00 != (Prefilter *)0x0) {
      Prefilter::~Prefilter(this_00);
    }
    operator_delete(this_00);
  }
  lVar4 = 8;
  for (uVar3 = 0;
      pEVar2 = (this->entries_).
               super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->entries_).
                             super__Vector_base<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x28);
      uVar3 = uVar3 + 1) {
    this_01 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                **)((long)&pEVar2->propagate_up_at_count + lVar4);
    if (this_01 !=
        (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
         *)0x0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(this_01);
    }
    operator_delete(this_01);
    lVar4 = lVar4 + 0x28;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->atom_index_to_id_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::~_Vector_base
            (&(this->prefilter_vec_).
              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->unfiltered_).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
  ::~_Rb_tree(&(this->node_map_)._M_t);
  std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::~vector
            (&this->entries_);
  return;
}

Assistant:

PrefilterTree::~PrefilterTree() {
  for (size_t i = 0; i < prefilter_vec_.size(); i++)
    delete prefilter_vec_[i];

  for (size_t i = 0; i < entries_.size(); i++)
    delete entries_[i].parents;
}